

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void vkt::QueryPool::anon_unknown_0::beginSecondaryCommandBuffer
               (DeviceInterface *vk,VkCommandBuffer commandBuffer,
               VkQueryPipelineStatisticFlags queryFlags,VkRenderPass renderPass,
               VkFramebuffer framebuffer,VkCommandBufferUsageFlags bufferUsageFlags)

{
  VkResult result;
  undefined4 local_88 [2];
  VkCommandBufferBeginInfo info;
  VkCommandBufferInheritanceInfo secCmdBufInheritInfo;
  VkCommandBufferUsageFlags bufferUsageFlags_local;
  VkQueryPipelineStatisticFlags queryFlags_local;
  VkCommandBuffer commandBuffer_local;
  DeviceInterface *vk_local;
  VkFramebuffer framebuffer_local;
  VkRenderPass renderPass_local;
  
  info.pInheritanceInfo._0_4_ = 0x29;
  local_88[0] = 0x2a;
  info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  info._4_4_ = 0;
  info._16_8_ = &info.pInheritanceInfo;
  info.pNext._0_4_ = bufferUsageFlags;
  result = (*vk->_vptr_DeviceInterface[0x49])(vk,commandBuffer,local_88);
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x92);
  return;
}

Assistant:

void beginSecondaryCommandBuffer (const DeviceInterface&				vk,
								  const VkCommandBuffer					commandBuffer,
								  const VkQueryPipelineStatisticFlags	queryFlags,
								  const VkRenderPass					renderPass = (VkRenderPass)0u,
								  const VkFramebuffer					framebuffer = (VkFramebuffer)0u,
								  const VkCommandBufferUsageFlags		bufferUsageFlags = VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT)
{
	const VkCommandBufferInheritanceInfo	secCmdBufInheritInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,
		DE_NULL,
		renderPass,					// renderPass
		0u,							// subpass
		framebuffer,				// framebuffer
		VK_FALSE,					// occlusionQueryEnable
		(VkQueryControlFlags)0u,	// queryFlags
		queryFlags,					// pipelineStatistics
	};

	const VkCommandBufferBeginInfo			info					=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType							sType;
		DE_NULL,										// const void*								pNext;
		bufferUsageFlags,								// VkCommandBufferUsageFlags				flags;
		&secCmdBufInheritInfo,							// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};
	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &info));
}